

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceAllocator.cxx
# Opt level: O0

void __thiscall
cmCTestResourceAllocator::InitializeFromResourceSpec
          (cmCTestResourceAllocator *this,cmCTestResourceSpec *spec)

{
  uint uVar1;
  bool bVar2;
  reference __k;
  mapped_type *this_00;
  reference __k_00;
  mapped_type *pmVar3;
  Resource *specRes;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_> *__range2;
  mapped_type *res;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
  *__range1;
  cmCTestResourceSpec *spec_local;
  cmCTestResourceAllocator *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  ::clear(&this->Resources);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                    *)spec);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                 *)spec);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar2) break;
    __k = std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>
          ::operator*(&__end1);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
              ::operator[](&this->Resources,&__k->first);
    __end2 = std::
             vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>::
             begin(&__k->second);
    specRes = (Resource *)
              std::
              vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>
              ::end(&__k->second);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmCTestResourceSpec::Resource_*,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>
                                  *)&specRes);
      if (!bVar2) break;
      __k_00 = __gnu_cxx::
               __normal_iterator<const_cmCTestResourceSpec::Resource_*,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>
               ::operator*(&__end2);
      uVar1 = __k_00->Capacity;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
               ::operator[](this_00,&__k_00->Id);
      pmVar3->Total = uVar1;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>
               ::operator[](this_00,&__k_00->Id);
      pmVar3->Locked = 0;
      __gnu_cxx::
      __normal_iterator<const_cmCTestResourceSpec::Resource_*,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>
      ::operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmCTestResourceAllocator::InitializeFromResourceSpec(
  const cmCTestResourceSpec& spec)
{
  this->Resources.clear();

  for (auto const& it : spec.LocalSocket.Resources) {
    auto& res = this->Resources[it.first];
    for (auto const& specRes : it.second) {
      res[specRes.Id].Total = specRes.Capacity;
      res[specRes.Id].Locked = 0;
    }
  }
}